

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::
     PrintTupleTo<std::tuple<std::__cxx11::ostringstream&,std::__cxx11::string_const&,std::_Ios_Openmode>,3ul>
               (_Ios_Openmode *t,ostream *param_2)

{
  PrintTupleTo<std::tuple<std::__cxx11::ostringstream&,std::__cxx11::string_const&,std::_Ios_Openmode>,2ul>
            ();
  std::operator<<(param_2,", ");
  internal_stream_operator_without_lexical_name_lookup::StreamPrinter::
  PrintValue<std::_Ios_Openmode,void,std::ostream&>(t,param_2);
  return;
}

Assistant:

void PrintTupleTo(const T& t, std::integral_constant<size_t, I>,
                  ::std::ostream* os) {
  PrintTupleTo(t, std::integral_constant<size_t, I - 1>(), os);
  GTEST_INTENTIONAL_CONST_COND_PUSH_()
  if (I > 1) {
    GTEST_INTENTIONAL_CONST_COND_POP_()
    *os << ", ";
  }
  UniversalPrinter<typename std::tuple_element<I - 1, T>::type>::Print(
      std::get<I - 1>(t), os);
}